

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall FlowGraph::RemoveUnreachableBlocks(FlowGraph *this)

{
  undefined1 *puVar1;
  BasicBlock *pBVar2;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  BasicBlock *pBVar7;
  Type *ppFVar8;
  Iterator local_48;
  FlowGraph *local_38;
  
  pBVar7 = this->blockList;
  local_38 = this;
  if (pBVar7 == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x963,"(this->blockList)","this->blockList");
    if (!bVar5) {
LAB_00411115:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
    pBVar7 = local_38->blockList;
  }
  do {
    if ((*(ushort *)&pBVar7->field_0x18 & 1) == 0) {
      *(ushort *)&pBVar7->field_0x18 = *(ushort *)&pBVar7->field_0x18 & 0xffde;
    }
    pBVar7 = pBVar7->next;
  } while (pBVar7 != (BasicBlock *)0x0);
  puVar1 = &local_38->blockList->field_0x18;
  *(ushort *)puVar1 = *(ushort *)puVar1 | 0x20;
  pBVar7 = local_38->blockList;
  if (pBVar7 != (BasicBlock *)0x0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pBVar2 = pBVar7->next;
      if ((*(ushort *)&pBVar7->field_0x18 & 1) == 0) {
        if ((*(ushort *)&pBVar7->field_0x18 & 0x20) == 0) {
          RemoveBlock(local_38,pBVar7,(GlobOpt *)0x0,false);
        }
        else {
          local_48.list =
               &(pBVar7->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
          local_48.current = &(local_48.list)->super_SListNodeBase<Memory::ArenaAllocator>;
          while( true ) {
            if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48.current ==
                (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar5) goto LAB_00411115;
              *puVar6 = 0;
            }
            pSVar3 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                     (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                      &(local_48.current)->next)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            if (pSVar3 == local_48.list) break;
            local_48.current = (NodeBase *)pSVar3;
            ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                (&local_48);
            pBVar7 = (*ppFVar8)->succBlock;
            if (pBVar7 == (BasicBlock *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar6 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                 ,0x971,"(succ)","succ");
              if (!bVar5) goto LAB_00411115;
              *puVar6 = 0;
            }
            puVar1 = &pBVar7->field_0x18;
            *puVar1 = *puVar1 | 0x20;
          }
        }
      }
      pBVar7 = pBVar2;
    } while (pBVar2 != (BasicBlock *)0x0);
  }
  return;
}

Assistant:

void
FlowGraph::RemoveUnreachableBlocks()
{
    AnalysisAssert(this->blockList);

    FOREACH_BLOCK(block, this)
    {
        block->isVisited = false;
    }
    NEXT_BLOCK;

    this->blockList->isVisited = true;

    FOREACH_BLOCK_EDITING(block, this)
    {
        if (block->isVisited)
        {
            FOREACH_SUCCESSOR_BLOCK(succ, block)
            {
                succ->isVisited = true;
            } NEXT_SUCCESSOR_BLOCK;
        }
        else
        {
            this->RemoveBlock(block);
        }
    }
    NEXT_BLOCK_EDITING;
}